

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O0

MeshGL * CubeSTL(void)

{
  float fVar1;
  undefined4 uVar2;
  uint uVar3;
  const_iterator piVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  V *pVVar7;
  double *pdVar8;
  V *pVVar9;
  vec<double,_3> *a;
  MeshGLP<float,_unsigned_int> *in_RDI;
  value_type_conflict1 local_334;
  float local_330;
  int local_32c;
  const_iterator piStack_328;
  int j_2;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  undefined4 local_310;
  undefined4 local_30c;
  initializer_list<int> local_308;
  initializer_list<int> *local_2f8;
  initializer_list<int> *__range3_2;
  const_iterator piStack_2e8;
  int j_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  undefined4 local_2d0;
  undefined4 local_2cc;
  initializer_list<int> local_2c8;
  initializer_list<int> *local_2b8;
  initializer_list<int> *__range3_1;
  const_iterator piStack_2a8;
  int i_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  undefined4 local_290;
  undefined4 local_28c;
  initializer_list<int> local_288;
  initializer_list<int> *local_278;
  initializer_list<int> *__range2_1;
  apply_t<detail::op_sub,_linalg::vec<double,_3>,_linalg::vec<double,_3>_> local_258;
  vec<double,_3> local_240;
  undefined1 local_228 [8];
  vec3 normal;
  int j;
  const_iterator __end3;
  const_iterator __begin3;
  undefined4 local_1f0;
  undefined4 local_1ec;
  initializer_list<int> local_1e8;
  initializer_list<int> *local_1d8;
  initializer_list<int> *__range3;
  const_iterator piStack_1c8;
  int i;
  const_iterator __end2;
  const_iterator __begin2;
  undefined4 local_1b0;
  undefined4 local_1ac;
  initializer_list<int> local_1a8;
  initializer_list<int> *local_198;
  initializer_list<int> *__range2;
  mat3 triPos;
  size_t vert;
  size_t tri;
  double local_128;
  vec<double,_3> local_120;
  Manifold local_108 [16];
  undefined1 local_f8 [8];
  MeshGL cubeIn;
  MeshGL *cube;
  
  local_128 = 1.0;
  linalg::vec<double,_3>::vec(&local_120,&local_128);
  manifold::Manifold::Cube(local_108,1);
  manifold::Manifold::GetMeshGL((int)local_f8);
  manifold::Manifold::~Manifold(local_108);
  manifold::MeshGLP<float,_unsigned_int>::MeshGLP(in_RDI);
  in_RDI->numProp = 6;
  triPos.z.z = 0.0;
  for (vert = 0;
      uVar3 = manifold::MeshGLP<float,_unsigned_int>::NumTri
                        ((MeshGLP<float,_unsigned_int> *)local_f8), vert < uVar3; vert = vert + 1) {
    linalg::mat<double,_3,_3>::mat((mat<double,_3,_3> *)&__range2);
    __begin2._4_4_ = 0;
    local_1b0 = 1;
    local_1ac = 2;
    local_1a8._M_array = (iterator)((long)&__begin2 + 4);
    local_1a8._M_len = 3;
    local_198 = &local_1a8;
    __end2 = std::initializer_list<int>::begin(local_198);
    piStack_1c8 = std::initializer_list<int>::end(local_198);
    for (; __end2 != piStack_1c8; __end2 = __end2 + 1) {
      __range3._4_4_ = *__end2;
      __range3._0_4_ = SUB84(triPos.z.z,0);
      triPos.z.z = (double)((long)triPos.z.z + 1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&in_RDI->triVerts,(value_type_conflict1 *)&__range3);
      __begin3._4_4_ = 0;
      local_1f0 = 1;
      local_1ec = 2;
      local_1e8._M_array = (iterator)((long)&__begin3 + 4);
      local_1e8._M_len = 3;
      local_1d8 = &local_1e8;
      __end3 = std::initializer_list<int>::begin(local_1d8);
      piVar4 = std::initializer_list<int>::end(local_1d8);
      for (; uVar2 = local_f8._0_4_, __end3 != piVar4; __end3 = __end3 + 1) {
        normal.z._4_4_ = *__end3;
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &cubeIn.vertProperties.super__Vector_base<float,_std::allocator<float>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            vert * 3 + (long)__range3._4_4_);
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)&cubeIn,
                            (ulong)(uVar2 * *pvVar5 + normal.z._4_4_));
        fVar1 = *pvVar6;
        pVVar7 = linalg::mat<double,_3,_3>::operator[]
                           ((mat<double,_3,_3> *)&__range2,__range3._4_4_);
        pdVar8 = linalg::vec<double,_3>::operator[](pVVar7,normal.z._4_4_);
        *pdVar8 = (double)fVar1;
      }
    }
    pVVar7 = linalg::mat<double,_3,_3>::operator[]((mat<double,_3,_3> *)&__range2,1);
    pVVar9 = linalg::mat<double,_3,_3>::operator[]((mat<double,_3,_3> *)&__range2,0);
    linalg::operator-(&local_258,pVVar7,pVVar9);
    pVVar7 = linalg::mat<double,_3,_3>::operator[]((mat<double,_3,_3> *)&__range2,2);
    pVVar9 = linalg::mat<double,_3,_3>::operator[]((mat<double,_3,_3> *)&__range2,0);
    linalg::operator-((apply_t<detail::op_sub,_linalg::vec<double,_3>,_linalg::vec<double,_3>_> *)
                      &__range2_1,pVVar7,pVVar9);
    linalg::cross<double>(&local_240,&local_258,(vec<double,_3> *)&__range2_1);
    linalg::normalize<double,3>((vec<double,_3> *)local_228,(linalg *)&local_240,a);
    __begin2_1._4_4_ = 0;
    local_290 = 1;
    local_28c = 2;
    local_288._M_array = (iterator)((long)&__begin2_1 + 4);
    local_288._M_len = 3;
    local_278 = &local_288;
    __end2_1 = std::initializer_list<int>::begin(local_278);
    piStack_2a8 = std::initializer_list<int>::end(local_278);
    for (; __end2_1 != piStack_2a8; __end2_1 = __end2_1 + 1) {
      __range3_1._4_4_ = *__end2_1;
      __begin3_1._4_4_ = 0;
      local_2d0 = 1;
      local_2cc = 2;
      local_2c8._M_array = (iterator)((long)&__begin3_1 + 4);
      local_2c8._M_len = 3;
      local_2b8 = &local_2c8;
      __end3_1 = std::initializer_list<int>::begin(local_2b8);
      piStack_2e8 = std::initializer_list<int>::end(local_2b8);
      for (; __end3_1 != piStack_2e8; __end3_1 = __end3_1 + 1) {
        __range3_2._4_4_ = *__end3_1;
        pVVar7 = linalg::mat<double,_3,_3>::operator[]
                           ((mat<double,_3,_3> *)&__range2,__range3_1._4_4_);
        pdVar8 = linalg::vec<double,_3>::operator[](pVVar7,__range3_2._4_4_);
        __range3_2._0_4_ = (float)*pdVar8;
        std::vector<float,_std::allocator<float>_>::push_back
                  (&in_RDI->vertProperties,(value_type_conflict *)&__range3_2);
      }
      __begin3_2._4_4_ = 0;
      local_310 = 1;
      local_30c = 2;
      local_308._M_array = (iterator)((long)&__begin3_2 + 4);
      local_308._M_len = 3;
      local_2f8 = &local_308;
      __end3_2 = std::initializer_list<int>::begin(local_2f8);
      piStack_328 = std::initializer_list<int>::end(local_2f8);
      for (; __end3_2 != piStack_328; __end3_2 = __end3_2 + 1) {
        local_32c = *__end3_2;
        pdVar8 = linalg::vec<double,_3>::operator[]((vec<double,_3> *)local_228,local_32c);
        local_330 = (float)*pdVar8;
        std::vector<float,_std::allocator<float>_>::push_back(&in_RDI->vertProperties,&local_330);
      }
    }
  }
  local_334 = manifold::Manifold::ReserveIDs(1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&in_RDI->runOriginalID,&local_334);
  manifold::MeshGLP<float,_unsigned_int>::~MeshGLP((MeshGLP<float,_unsigned_int> *)local_f8);
  return in_RDI;
}

Assistant:

MeshGL CubeSTL() {
  const MeshGL cubeIn = Manifold::Cube(vec3(1), true).GetMeshGL();
  MeshGL cube;
  cube.numProp = 6;

  for (size_t tri = 0, vert = 0; tri < cubeIn.NumTri(); tri++) {
    mat3 triPos;
    for (const int i : {0, 1, 2}) {
      cube.triVerts.push_back(vert++);

      for (const int j : {0, 1, 2}) {
        triPos[i][j] =
            cubeIn
                .vertProperties[cubeIn.numProp * cubeIn.triVerts[3 * tri + i] +
                                j];
      }
    }

    const vec3 normal =
        la::normalize(la::cross(triPos[1] - triPos[0], triPos[2] - triPos[0]));
    for (const int i : {0, 1, 2}) {
      for (const int j : {0, 1, 2}) {
        cube.vertProperties.push_back(triPos[i][j]);
      }
      for (const int j : {0, 1, 2}) {
        cube.vertProperties.push_back(normal[j]);
      }
    }
  }

  cube.runOriginalID.push_back(Manifold::ReserveIDs(1));

  return cube;
}